

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O2

QString * __thiscall QTextFragment::text(QString *__return_storage_ptr__,QTextFragment *this)

{
  QTextDocumentPrivate *pQVar1;
  QTextFragmentData *pQVar2;
  uint n;
  char16_t *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->p;
  if ((pQVar1 == (QTextDocumentPrivate *)0x0) || (n = this->n, n == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004ac1a9;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    local_50.d = (pQVar1->text).d.d;
    local_50.ptr = (pQVar1->text).d.ptr;
    local_50.size = (pQVar1->text).d.size;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      n = this->n;
    }
    for (; n != this->ne;
        n = QFragmentMapData<QTextFragmentData>::next(&(this->p->fragments).data,n)) {
      pcVar3 = local_50.ptr;
      if (local_50.ptr == (char16_t *)0x0) {
        pcVar3 = (char16_t *)&QString::_empty;
      }
      pQVar2 = (this->p->fragments).data.field_0.fragments;
      QString::QString((QString *)&QStack_68,(QChar *)(pcVar3 + pQVar2[n].stringPosition),
                       (ulong)pQVar2[n].super_QFragment<1>.size_array[0]);
      QString::append((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004ac1a9:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QTextFragment::text() const
{
    if (!p || !n)
        return QString();

    QString result;
    QString buffer = p->buffer();
    int f = n;
    while (f != ne) {
        const QTextFragmentData * const frag = p->fragmentMap().fragment(f);
        result += QString(buffer.constData() + frag->stringPosition, frag->size_array[0]);
        f = p->fragmentMap().next(f);
    }
    return result;
}